

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_mpsc_llfifo.c
# Opt level: O1

int cesl_mpsc_llfifo_push(cesl_mpsc_llfifo_t *self,char *elm_ptr,size_t elem_size)

{
  ulong uVar1;
  bool bVar2;
  
  if (elem_size == 0) {
    elem_size = self->elem_max_size_;
  }
  uVar1 = self->elems_max_count_ - 1 & self->write_index_ + 1;
  bVar2 = uVar1 != self->read_index_;
  if (bVar2) {
    memcpy(self->fifo_buffer_ + self->write_index_ * self->elem_max_size_ + 1,elm_ptr,elem_size);
    LOCK();
    self->write_index_ = uVar1;
    UNLOCK();
  }
  return (uint)bVar2;
}

Assistant:

int cesl_mpsc_llfifo_push (cesl_mpsc_llfifo_t* self, const char* elm_ptr, size_t elem_size )
{
    elem_size = elem_size == 0 ? self->elem_max_size_ : elem_size;

    size_t next_write_index = cesl_mpsc_llfifo_inc_index(self, cesl_mpsc_llfifo_write_index(self));
    if ( next_write_index != cesl_mpsc_llfifo_read_index(self) ) {
        char* dst_ptr = cesl_mpsc_llfifo_get_ptr_to_index(self, cesl_mpsc_llfifo_write_index(self));
        memcpy (dst_ptr, elm_ptr, elem_size);
        cesl_mpsc_llfifo_write_index_set(self, next_write_index);
        return 1;
    }
    return 0;
}